

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int fixupReg(InternalInstruction *insn,OperandSpecifier *op)

{
  byte bVar1;
  uint uVar2;
  uint8_t local_21;
  OperandSpecifier *pOStack_20;
  uint8_t valid;
  OperandSpecifier *op_local;
  InternalInstruction *insn_local;
  
  uVar2 = (uint)op->encoding;
  pOStack_20 = op;
  op_local = (OperandSpecifier *)insn;
  if (uVar2 == 1) {
    bVar1 = fixupRegValue(insn,(uint)op->type,(char)insn->reg - (char)insn->regBase,&local_21);
    *(uint *)(op_local + 0x4ec) = (uint)bVar1;
    if (local_21 == '\0') {
      return -1;
    }
  }
  else if (uVar2 - 2 < 7) {
    if (insn->eaRegBase <= insn->eaBase) {
      bVar1 = fixupRMValue(insn,(uint)op->type,(char)insn->eaBase - (char)insn->eaRegBase,&local_21)
      ;
      *(uint *)(op_local + 0x4e8) = (uint)bVar1;
      if (local_21 == '\0') {
        return -1;
      }
    }
  }
  else {
    if (uVar2 != 9) {
      return -1;
    }
    bVar1 = fixupRegValue(insn,(uint)op->type,(uint8_t)insn->vvvv,&local_21);
    *(uint *)(op_local + 0x4d0) = (uint)bVar1;
    if (local_21 == '\0') {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int fixupReg(struct InternalInstruction *insn,
		const struct OperandSpecifier *op)
{
	uint8_t valid;

	// dbgprintf(insn, "fixupReg()");

	switch ((OperandEncoding)op->encoding) {
		default:
			//debug("Expected a REG or R/M encoding in fixupReg");
			return -1;
		case ENCODING_VVVV:
			insn->vvvv = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					insn->vvvv,
					&valid);
			if (!valid)
				return -1;
			break;
		case ENCODING_REG:
			insn->reg = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					(uint8_t)(insn->reg - insn->regBase),
					&valid);
			if (!valid)
				return -1;
			break;
		CASE_ENCODING_RM:
			if (insn->eaBase >= insn->eaRegBase) {
				insn->eaBase = (EABase)fixupRMValue(insn,
						(OperandType)op->type,
						(uint8_t)(insn->eaBase - insn->eaRegBase),
						&valid);
				if (!valid)
					return -1;
			}
			break;
	}

	return 0;
}